

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O0

void __thiscall
deci::parser_t::basic_symbol<deci::parser_t::by_state>::move
          (basic_symbol<deci::parser_t::by_state> *this,basic_symbol<deci::parser_t::by_state> *s)

{
  counter_type cVar1;
  symbol_kind_type sVar2;
  basic_symbol<deci::parser_t::by_state> *s_local;
  basic_symbol<deci::parser_t::by_state> *this_local;
  
  by_state::move(&this->super_by_state,&s->super_by_state);
  sVar2 = by_state::kind(&this->super_by_state);
  switch(sVar2) {
  case S_NUMBER:
    value_type::move<double>(&this->value,&s->value);
    break;
  case S_IDENTIFIER:
  case S_CMP_OPERATOR:
    value_type::move<std::__cxx11::string>(&this->value,&s->value);
    break;
  default:
    break;
  case S_42_argument_list_:
  case S_argument_list:
    value_type::move<deci::ast_arg_list_t*>(&this->value,&s->value);
    break;
  case S_43_statement_list_:
  case S_statement_list:
    value_type::move<deci::ast_t*>(&this->value,&s->value);
    break;
  case S_statement:
  case S_expression_statement:
  case S_expression:
  case S_assign_expr:
  case S_or_expr:
  case S_xor_expr:
  case S_and_expr:
  case S_eql_expr:
  case S_cmp_expr:
  case S_add_expr:
  case S_mul_expr:
  case S_pow_expr:
  case S_unary_expr:
  case S_postfix_expr:
  case S_primary_expr:
  case S_if_statement:
  case S_for_statement:
  case S_while_statement:
  case S_repeat_statement:
    value_type::move<deci::ast_item_t*>(&this->value,&s->value);
    break;
  case S_exit_statement:
    value_type::move<deci::ast_exit_t*>(&this->value,&s->value);
  }
  (this->location).begin.filename = (s->location).begin.filename;
  cVar1 = (s->location).begin.column;
  (this->location).begin.line = (s->location).begin.line;
  (this->location).begin.column = cVar1;
  (this->location).end.filename = (s->location).end.filename;
  cVar1 = (s->location).end.column;
  (this->location).end.line = (s->location).end.line;
  (this->location).end.column = cVar1;
  return;
}

Assistant:

void
   parser_t ::basic_symbol<Base>::move (basic_symbol& s)
  {
    super_type::move (s);
    switch (this->kind ())
    {
      case symbol_kind::S_42_argument_list_: // "argument list"
      case symbol_kind::S_argument_list: // argument_list
        value.move< ast_arg_list_t* > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_exit_statement: // exit_statement
        value.move< ast_exit_t* > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_statement: // statement
      case symbol_kind::S_expression_statement: // expression_statement
      case symbol_kind::S_expression: // expression
      case symbol_kind::S_assign_expr: // assign_expr
      case symbol_kind::S_or_expr: // or_expr
      case symbol_kind::S_xor_expr: // xor_expr
      case symbol_kind::S_and_expr: // and_expr
      case symbol_kind::S_eql_expr: // eql_expr
      case symbol_kind::S_cmp_expr: // cmp_expr
      case symbol_kind::S_add_expr: // add_expr
      case symbol_kind::S_mul_expr: // mul_expr
      case symbol_kind::S_pow_expr: // pow_expr
      case symbol_kind::S_unary_expr: // unary_expr
      case symbol_kind::S_postfix_expr: // postfix_expr
      case symbol_kind::S_primary_expr: // primary_expr
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_for_statement: // for_statement
      case symbol_kind::S_while_statement: // while_statement
      case symbol_kind::S_repeat_statement: // repeat_statement
        value.move< ast_item_t* > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_43_statement_list_: // "statement list"
      case symbol_kind::S_statement_list: // statement_list
        value.move< ast_t* > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_NUMBER: // "number"
        value.move< double > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "identifier"
      case symbol_kind::S_CMP_OPERATOR: // CMP_OPERATOR
        value.move< std::string > (YY_MOVE (s.value));
        break;

      default:
        break;
    }

    location = YY_MOVE (s.location);
  }